

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::WidenInteger
          (GraphicsRobustAccessPass *this,bool sign_extend,uint32_t bit_width,Instruction *value,
          Instruction *before_inst)

{
  uint32_t type_id;
  uint32_t result_id;
  TypeManager *pTVar1;
  Type *type;
  Instruction *pIVar2;
  undefined7 in_register_00000031;
  initializer_list<unsigned_int> init_list;
  uint32_t local_d4 [3];
  SmallVector<unsigned_int,_2UL> local_c8;
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  Integer unsigned_type_for_query;
  
  unsigned_type_for_query.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unsigned_type_for_query.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unsigned_type_for_query.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unsigned_type_for_query.super_Type.kind_ = kInteger;
  unsigned_type_for_query.super_Type._vptr_Type = (_func_int **)&PTR__Type_00a6c948;
  unsigned_type_for_query.signed_ = false;
  unsigned_type_for_query.super_Type._36_4_ = bit_width;
  pTVar1 = IRContext::get_type_mgr((this->super_Pass).context_);
  type = analysis::TypeManager::GetRegisteredType(pTVar1,&unsigned_type_for_query.super_Type);
  pTVar1 = IRContext::get_type_mgr((this->super_Pass).context_);
  type_id = analysis::TypeManager::GetId(pTVar1,type);
  result_id = Pass::TakeNextId(&this->super_Pass);
  local_d4[0] = Instruction::result_id(value);
  init_list._M_len = 1;
  init_list._M_array = local_d4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list);
  local_d4[1] = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,&local_a0);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
             local_d4 + 1,&local_a0);
  pIVar2 = InsertInst(this,before_inst,(int)CONCAT71(in_register_00000031,sign_extend) + OpUConvert,
                      type_id,result_id,(OperandList *)&local_78);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  analysis::Type::~Type(&unsigned_type_for_query.super_Type);
  return pIVar2;
}

Assistant:

opt::Instruction* opt::GraphicsRobustAccessPass::WidenInteger(
    bool sign_extend, uint32_t bit_width, Instruction* value,
    Instruction* before_inst) {
  analysis::Integer unsigned_type_for_query(bit_width, false);
  auto* type_mgr = context()->get_type_mgr();
  auto* unsigned_type = type_mgr->GetRegisteredType(&unsigned_type_for_query);
  auto type_id = context()->get_type_mgr()->GetId(unsigned_type);
  auto conversion_id = TakeNextId();
  auto* conversion = InsertInst(
      before_inst, (sign_extend ? spv::Op::OpSConvert : spv::Op::OpUConvert),
      type_id, conversion_id, {{SPV_OPERAND_TYPE_ID, {value->result_id()}}});
  return conversion;
}